

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::beginAttachment
          (LibraryKinematicsModelsLoader *this,Type attachmentType,
          attachment_AttributeData *attributeData)

{
  KinematicAttachment *this_00;
  _Elt_pointer ppKVar1;
  String joint;
  String local_b8;
  SidAddress local_98;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,attributeData->joint,(allocator<char> *)&local_98);
  this_00 = (KinematicAttachment *)operator_new(0xe0);
  SidAddress::SidAddress(&local_98,&local_b8);
  KinematicAttachment::KinematicAttachment(this_00,attachmentType,&local_98);
  this->mCurrentAttachment = this_00;
  SidAddress::~SidAddress(&local_98);
  ppKVar1 = (this->mLinkStack).c.
            super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppKVar1 ==
      (this->mLinkStack).c.
      super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppKVar1 = (this->mLinkStack).c.
              super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  KinematicLink::addAttachment(ppKVar1[-1],this->mCurrentAttachment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool LibraryKinematicsModelsLoader::beginAttachment( KinematicAttachment::Type attachmentType, const attachment_AttributeData& attributeData )
	{
		String joint(attributeData.joint);
		mCurrentAttachment = new KinematicAttachment( attachmentType, joint);
		COLLADABU_ASSERT( !mLinkStack.empty() );
		KinematicLink* link = mLinkStack.top();
		link->addAttachment( mCurrentAttachment );
		return true;
	}